

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

CavsByBdryStatus *
Omega_h::separate_cavities
          (CavsByBdryStatus *__return_storage_ptr__,Mesh *old_mesh,Mesh *new_mesh,Cavs *cavs,
          Int key_dim,LOs *keys2kds,Graph *keys2doms)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL> *this;
  pointer pCVar3;
  undefined8 uVar4;
  Alloc *pAVar5;
  LOs new_elem_class_ids;
  LOs old_elem_class_ids;
  LOs bdry_cavs2cavs;
  Bytes cavs_are_bdry;
  Read<int> old_elems_are_bdry;
  Bytes keys_are_bdry;
  Read<int> new_bdry_colors;
  Read<signed_char> new_elems_are_bdry;
  LOs touch_cavs2cavs;
  Read<signed_char> key_class_dims;
  Read<signed_char> kd_class_dims;
  LOs int_cavs2cavs;
  Read<int> cavs2nbdry_elems;
  Read<signed_char> old_elems_are_bdry_i8;
  Bytes cavs_touch_bdry;
  Read<signed_char> keys_arent_bdry;
  Read<signed_char> cavs_arent_bdry;
  Alloc *local_528;
  Alloc *local_518;
  void *local_510;
  Alloc *local_508;
  void *local_500;
  Alloc *local_4f8;
  void *local_4f0;
  Alloc *local_4e8;
  element_type *local_4e0;
  Alloc *local_4d8;
  pointer local_4d0;
  undefined1 local_4c8 [72];
  Omega_h *local_480;
  Omega_h *local_478;
  Omega_h *local_470;
  Omega_h *local_468;
  Mesh *local_460;
  LOs local_458;
  LOs local_448;
  LOs local_438;
  LOs local_428;
  LOs local_418;
  LOs local_408;
  Read<signed_char> local_3f8;
  Alloc *local_3e8;
  element_type *local_3e0;
  LOs local_3d8;
  LOs local_3c8;
  LOs local_3b8;
  LOs local_3a8;
  Read<signed_char> local_398;
  Alloc *local_388;
  void *local_380;
  Alloc *local_378;
  void *local_370;
  LOs local_368;
  Read<signed_char> local_358;
  Alloc *local_348;
  void *local_340;
  Bytes local_338;
  Bytes local_328;
  Read<signed_char> local_318;
  Read<signed_char> local_308;
  Alloc *local_2f8;
  void *local_2f0;
  Alloc *local_2e8;
  element_type *local_2e0;
  Read<signed_char> local_2d8;
  Alloc *local_2c8;
  void *local_2c0;
  Read<int> local_2b8;
  Read<int> local_2a8;
  Graph local_298;
  Alloc *local_278;
  pointer local_270;
  Read<signed_char> local_268;
  Alloc *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  Graph local_248;
  CavsByColor local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  element_type *local_208;
  Read<signed_char> local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  element_type *local_1e8;
  Write<signed_char> local_1e0;
  Read<signed_char> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  element_type *local_1b8;
  Cavs local_1b0;
  Cavs local_170;
  Cavs local_130;
  Cavs local_f0;
  Cavs local_b0;
  Cavs local_70;
  
  local_460 = new_mesh;
  memset(__return_storage_ptr__,0,0xd8);
  get_elems_are_bdry((Omega_h *)&local_258,old_mesh);
  local_268.write_.shared_alloc_.alloc = local_258;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268.write_.shared_alloc_.alloc = (Alloc *)(local_258->size * 8 + 1);
    }
    else {
      local_258->use_count = local_258->use_count + 1;
    }
  }
  local_268.write_.shared_alloc_.direct_ptr = local_250._M_pi;
  array_cast<int,signed_char>((Omega_h *)&local_4d8,&local_268);
  pAVar5 = local_268.write_.shared_alloc_.alloc;
  if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
      local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_298.a2ab.write_.shared_alloc_.alloc = (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc
  ;
  if (((ulong)local_298.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_298.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_298.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_298.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_298.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_298.a2ab.write_.shared_alloc_.direct_ptr =
       (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
  local_298.ab2b.write_.shared_alloc_.alloc = (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc
  ;
  if (((ulong)local_298.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_298.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_298.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_298.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_298.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_298.ab2b.write_.shared_alloc_.direct_ptr =
       (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
  local_2a8.write_.shared_alloc_.alloc = local_4d8;
  if (((ulong)local_4d8 & 7) == 0 && local_4d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.write_.shared_alloc_.alloc = (Alloc *)(local_4d8->size * 8 + 1);
    }
    else {
      local_4d8->use_count = local_4d8->use_count + 1;
    }
  }
  local_2a8.write_.shared_alloc_.direct_ptr = local_4d0;
  graph_reduce<int>((Omega_h *)&local_278,&local_298,&local_2a8,1,OMEGA_H_SUM);
  pAVar5 = local_2a8.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_298.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_298.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_298.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_298.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_298.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_298.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_298.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_298.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298.a2ab.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_2b8.write_.shared_alloc_.alloc = local_278;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2b8.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
    }
    else {
      local_278->use_count = local_278->use_count + 1;
    }
  }
  local_2b8.write_.shared_alloc_.direct_ptr = local_270;
  each_gt<int>((Omega_h *)&local_4e8,&local_2b8,0);
  pAVar5 = local_2b8.write_.shared_alloc_.alloc;
  if (((ulong)local_2b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_1d0.write_.shared_alloc_.alloc = local_4e8;
  if (((ulong)local_4e8 & 7) == 0 && local_4e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d0.write_.shared_alloc_.alloc = (Alloc *)(local_4e8->size * 8 + 1);
    }
    else {
      local_4e8->use_count = local_4e8->use_count + 1;
    }
  }
  local_1d0.write_.shared_alloc_.direct_ptr = local_4e0;
  local_468 = (Omega_h *)&local_1c0;
  invert_marks(local_468,&local_1d0);
  pAVar5 = local_1d0.write_.shared_alloc_.alloc;
  if (((ulong)local_1d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_1d0.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_1d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_2d8.write_.shared_alloc_.alloc = (Alloc *)local_1c0._M_pi;
  if (((ulong)local_1c0._M_pi & 7) == 0 && (Alloc *)local_1c0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_1c0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1c0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1c0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_2d8.write_.shared_alloc_.direct_ptr = local_1b8;
  collect_marked((Omega_h *)&local_2c8,&local_2d8);
  pAVar5 = local_2d8.write_.shared_alloc_.alloc;
  if (((ulong)local_2d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2d8.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_3c8.write_.shared_alloc_.alloc = local_2c8;
  if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_3c8.write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
    }
    else {
      local_2c8->use_count = local_2c8->use_count + 1;
    }
  }
  local_3c8.write_.shared_alloc_.direct_ptr = local_2c0;
  local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
       (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_70.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
       (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
  local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
       (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_70.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
       (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
  local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
       (cavs->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_70.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
       (cavs->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
  local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
       (cavs->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_70.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
       (cavs->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
  unmap_cavs((Cavs *)local_4c8,&local_3c8,&local_70);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
            ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)__return_storage_ptr__,
             (Cavs *)local_4c8);
  Cavs::~Cavs((Cavs *)local_4c8);
  Cavs::~Cavs(&local_70);
  pAVar5 = local_3c8.write_.shared_alloc_.alloc;
  if (((ulong)local_3c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_3c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_3c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_4c8._0_8_ = (Alloc *)(local_4c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_2e8,(Int)old_mesh,(string *)(ulong)(uint)key_dim);
  if ((Alloc *)local_4c8._0_8_ != (Alloc *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_,(ulong)((long)(size_t *)local_4c8._16_8_ + 1));
  }
  local_3d8.write_.shared_alloc_.alloc = (keys2kds->write_).shared_alloc_.alloc;
  if (((ulong)local_3d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_3d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_3d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_3d8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_3d8.write_.shared_alloc_.alloc)->use_count =
           (local_3d8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_3d8.write_.shared_alloc_.direct_ptr = (keys2kds->write_).shared_alloc_.direct_ptr;
  local_308.write_.shared_alloc_.alloc = local_2e8;
  if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_308.write_.shared_alloc_.alloc = (Alloc *)(local_2e8->size * 8 + 1);
    }
    else {
      local_2e8->use_count = local_2e8->use_count + 1;
    }
  }
  local_308.write_.shared_alloc_.direct_ptr = local_2e0;
  unmap<signed_char>((Omega_h *)&local_1e0,&local_3d8,&local_308,1);
  read<signed_char>((Omega_h *)&local_2f8,&local_1e0);
  if (((ulong)local_1e0.shared_alloc_.alloc & 7) == 0 &&
      local_1e0.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_1e0.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_1e0.shared_alloc_.alloc);
      operator_delete(local_1e0.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_308.write_.shared_alloc_.alloc;
  if (((ulong)local_308.write_.shared_alloc_.alloc & 7) == 0 &&
      local_308.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_308.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_308.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_3d8.write_.shared_alloc_.alloc;
  if (((ulong)local_3d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_3d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_3d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_3f8.write_.shared_alloc_.alloc = local_2f8;
  if (((ulong)local_2f8 & 7) == 0 && local_2f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_3f8.write_.shared_alloc_.alloc = (Alloc *)(local_2f8->size * 8 + 1);
    }
    else {
      local_2f8->use_count = local_2f8->use_count + 1;
    }
  }
  local_3f8.write_.shared_alloc_.direct_ptr = local_2f0;
  if ((uint)old_mesh->dim_ < 4) {
    each_lt<signed_char>((Omega_h *)&local_3e8,&local_3f8,(char)old_mesh->dim_);
    pAVar5 = local_3f8.write_.shared_alloc_.alloc;
    if (((ulong)local_3f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_3f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_3f8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_3f8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_318.write_.shared_alloc_.alloc = local_3e8;
    if (((ulong)local_3e8 & 7) == 0 && local_3e8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_318.write_.shared_alloc_.alloc = (Alloc *)(local_3e8->size * 8 + 1);
      }
      else {
        local_3e8->use_count = local_3e8->use_count + 1;
      }
    }
    local_318.write_.shared_alloc_.direct_ptr = local_3e0;
    local_470 = (Omega_h *)&local_3e8;
    collect_marked((Omega_h *)&local_4f8,&local_318);
    pAVar5 = local_318.write_.shared_alloc_.alloc;
    if (((ulong)local_318.write_.shared_alloc_.alloc & 7) == 0 &&
        local_318.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_318.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_318.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_408.write_.shared_alloc_.alloc = local_4f8;
    if (((ulong)local_4f8 & 7) == 0 && local_4f8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_408.write_.shared_alloc_.alloc = (Alloc *)(local_4f8->size * 8 + 1);
      }
      else {
        local_4f8->use_count = local_4f8->use_count + 1;
      }
    }
    local_408.write_.shared_alloc_.direct_ptr = local_4f0;
    local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
    unmap_cavs((Cavs *)local_4c8,&local_408,&local_b0);
    this = __return_storage_ptr__->_M_elems + 2;
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
              (this->_M_elems,(Cavs *)local_4c8);
    Cavs::~Cavs((Cavs *)local_4c8);
    Cavs::~Cavs(&local_b0);
    pAVar5 = local_408.write_.shared_alloc_.alloc;
    if (((ulong)local_408.write_.shared_alloc_.alloc & 7) == 0 &&
        local_408.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_408.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_408.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    if (keys2doms != (Graph *)0x0) {
      local_418.write_.shared_alloc_.alloc = local_4f8;
      if (((ulong)local_4f8 & 7) == 0 && local_4f8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_418.write_.shared_alloc_.alloc = (Alloc *)(local_4f8->size * 8 + 1);
        }
        else {
          local_4f8->use_count = local_4f8->use_count + 1;
        }
      }
      local_418.write_.shared_alloc_.direct_ptr = local_4f0;
      local_248.a2ab.write_.shared_alloc_.alloc = (keys2doms->a2ab).write_.shared_alloc_.alloc;
      if (((ulong)local_248.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_248.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_248.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((local_248.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_248.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_248.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_248.a2ab.write_.shared_alloc_.direct_ptr =
           (keys2doms->a2ab).write_.shared_alloc_.direct_ptr;
      local_248.ab2b.write_.shared_alloc_.alloc = (keys2doms->ab2b).write_.shared_alloc_.alloc;
      if (((ulong)local_248.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_248.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_248.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((local_248.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_248.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_248.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_248.ab2b.write_.shared_alloc_.direct_ptr =
           (keys2doms->ab2b).write_.shared_alloc_.direct_ptr;
      unmap_graph((Graph *)local_4c8,&local_418,&local_248);
      Graph::operator=(keys2doms,(Graph *)local_4c8);
      if ((local_4c8._16_8_ & 7) == 0 && (Alloc *)local_4c8._16_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_4c8._16_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_4c8._16_8_);
          operator_delete((void *)local_4c8._16_8_,0x48);
        }
      }
      uVar4 = local_4c8._0_8_;
      if ((local_4c8._0_8_ & 7) == 0 && (Alloc *)local_4c8._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_4c8._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_4c8._0_8_);
          operator_delete((void *)uVar4,0x48);
        }
      }
      pAVar5 = local_248.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_248.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_248.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_248.ab2b.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_248.ab2b.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_248.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_248.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_248.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_248.a2ab.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_248.a2ab.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_418.write_.shared_alloc_.alloc;
      if (((ulong)local_418.write_.shared_alloc_.alloc & 7) == 0 &&
          local_418.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_418.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_418.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
    }
    local_200.write_.shared_alloc_.alloc = local_3e8;
    if (((ulong)local_3e8 & 7) == 0 && local_3e8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_200.write_.shared_alloc_.alloc = (Alloc *)(local_3e8->size * 8 + 1);
      }
      else {
        local_3e8->use_count = local_3e8->use_count + 1;
      }
    }
    local_200.write_.shared_alloc_.direct_ptr = local_3e0;
    invert_marks((Omega_h *)&local_1f0,&local_200);
    pAVar5 = local_200.write_.shared_alloc_.alloc;
    if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
        local_200.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_200.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_200.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_328.write_.shared_alloc_.alloc = local_4e8;
    if (((ulong)local_4e8 & 7) == 0 && local_4e8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_328.write_.shared_alloc_.alloc = (Alloc *)(local_4e8->size * 8 + 1);
      }
      else {
        local_4e8->use_count = local_4e8->use_count + 1;
      }
    }
    local_328.write_.shared_alloc_.direct_ptr = local_4e0;
    local_338.write_.shared_alloc_.alloc = (Alloc *)local_1f0._M_pi;
    if (((ulong)local_1f0._M_pi & 7) == 0 && (Alloc *)local_1f0._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_338.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_1f0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_1f0._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_1f0._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_338.write_.shared_alloc_.direct_ptr = local_1e8;
    local_480 = (Omega_h *)&local_210;
    local_478 = (Omega_h *)&local_1f0;
    land_each(local_480,&local_328,&local_338);
    pAVar5 = local_338.write_.shared_alloc_.alloc;
    if (((ulong)local_338.write_.shared_alloc_.alloc & 7) == 0 &&
        local_338.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_338.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_338.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_328.write_.shared_alloc_.alloc;
    if (((ulong)local_328.write_.shared_alloc_.alloc & 7) == 0 &&
        local_328.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_328.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_328.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_358.write_.shared_alloc_.alloc = (Alloc *)local_210._M_pi;
    if (((ulong)local_210._M_pi & 7) == 0 && (Alloc *)local_210._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_358.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_210._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_210._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_210._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_358.write_.shared_alloc_.direct_ptr = local_208;
    collect_marked((Omega_h *)&local_348,&local_358);
    pAVar5 = local_358.write_.shared_alloc_.alloc;
    if (((ulong)local_358.write_.shared_alloc_.alloc & 7) == 0 &&
        local_358.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_358.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_358.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    local_428.write_.shared_alloc_.alloc = local_348;
    if (((ulong)local_348 & 7) == 0 && local_348 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_428.write_.shared_alloc_.alloc = (Alloc *)(local_348->size * 8 + 1);
      }
      else {
        local_348->use_count = local_348->use_count + 1;
      }
    }
    local_428.write_.shared_alloc_.direct_ptr = local_340;
    local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
    unmap_cavs((Cavs *)local_4c8,&local_428,&local_f0);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
              (__return_storage_ptr__->_M_elems[1]._M_elems,(Cavs *)local_4c8);
    Cavs::~Cavs((Cavs *)local_4c8);
    Cavs::~Cavs(&local_f0);
    pAVar5 = local_428.write_.shared_alloc_.alloc;
    if (((ulong)local_428.write_.shared_alloc_.alloc & 7) == 0 &&
        local_428.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_428.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_428.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__->_M_elems[0]._M_elems + 1,
               __return_storage_ptr__->_M_elems[0]._M_elems[0].
               super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
               super__Vector_impl_data._M_start);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__->_M_elems[1]._M_elems + 1,
               __return_storage_ptr__->_M_elems[1]._M_elems[0].
               super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
               super__Vector_impl_data._M_start);
    get_elem_class_ids((Omega_h *)&local_508,old_mesh);
    get_elem_class_ids((Omega_h *)&local_518,local_460);
    pCVar3 = this->_M_elems[0].super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         *(Alloc **)&(pCVar3->keys2old_elems).a2ab.write_;
    if (((ulong)local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_130.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_130.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).a2ab.write_ + 8);
    local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_130.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_130.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).ab2b.write_ + 8);
    local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_130.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_130.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).a2ab.write_ + 8);
    local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_130.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_130.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).ab2b.write_ + 8);
    local_438.write_.shared_alloc_.alloc = local_508;
    if (((ulong)local_508 & 7) == 0 && local_508 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_438.write_.shared_alloc_.alloc = (Alloc *)(local_508->size * 8 + 1);
      }
      else {
        local_508->use_count = local_508->use_count + 1;
      }
    }
    local_438.write_.shared_alloc_.direct_ptr = local_500;
    local_368.write_.shared_alloc_.alloc = local_518;
    if (((ulong)local_518 & 7) == 0 && local_518 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_368.write_.shared_alloc_.alloc = (Alloc *)(local_518->size * 8 + 1);
      }
      else {
        local_518->use_count = local_518->use_count + 1;
      }
    }
    local_368.write_.shared_alloc_.direct_ptr = local_510;
    separate_by_color(&local_228,&local_130,&local_438,&local_368);
    local_4c8._0_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[1].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_4c8._8_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[1].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_4c8._16_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[1].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__->_M_elems[2]._M_elems[1].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    __return_storage_ptr__->_M_elems[2]._M_elems[1].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    __return_storage_ptr__->_M_elems[2]._M_elems[1].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
              ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)local_4c8);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_228);
    pAVar5 = local_368.write_.shared_alloc_.alloc;
    if (((ulong)local_368.write_.shared_alloc_.alloc & 7) == 0 &&
        local_368.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_368.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_368.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_438.write_.shared_alloc_.alloc;
    if (((ulong)local_438.write_.shared_alloc_.alloc & 7) == 0 &&
        local_438.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_438.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_438.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    Cavs::~Cavs(&local_130);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__->_M_elems[0]._M_elems + 2,
               __return_storage_ptr__->_M_elems[0]._M_elems[0].
               super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_528 = local_4d8;
    if (((ulong)local_4d8 & 7) == 0 && local_4d8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_528 = (Alloc *)(local_4d8->size * 8 + 1);
      }
      else {
        local_4d8->use_count = local_4d8->use_count + 1;
      }
    }
    get_elems_are_bdry((Omega_h *)&local_378,local_460);
    local_398.write_.shared_alloc_.alloc = local_378;
    if (((ulong)local_378 & 7) == 0 && local_378 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_398.write_.shared_alloc_.alloc = (Alloc *)(local_378->size * 8 + 1);
      }
      else {
        local_378->use_count = local_378->use_count + 1;
      }
    }
    local_398.write_.shared_alloc_.direct_ptr = local_370;
    array_cast<int,signed_char>((Omega_h *)&local_388,&local_398);
    pAVar5 = local_398.write_.shared_alloc_.alloc;
    if (((ulong)local_398.write_.shared_alloc_.alloc & 7) == 0 &&
        local_398.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_398.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_398.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pCVar3 = __return_storage_ptr__->_M_elems[1]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         *(Alloc **)&(pCVar3->keys2old_elems).a2ab.write_;
    if (((ulong)local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_170.keys2old_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_170.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).a2ab.write_ + 8);
    local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_170.keys2old_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_170.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).ab2b.write_ + 8);
    local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_170.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_170.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).a2ab.write_ + 8);
    local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_170.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_170.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).ab2b.write_ + 8);
    local_448.write_.shared_alloc_.alloc = local_528;
    if (((ulong)local_528 & 7) == 0 && local_528 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_448.write_.shared_alloc_.alloc = (Alloc *)(local_528->size * 8 + 1);
      }
      else {
        local_528->use_count = local_528->use_count + 1;
      }
    }
    local_448.write_.shared_alloc_.direct_ptr = local_4d0;
    local_3a8.write_.shared_alloc_.alloc = local_388;
    if (((ulong)local_388 & 7) == 0 && local_388 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_3a8.write_.shared_alloc_.alloc = (Alloc *)(local_388->size * 8 + 1);
      }
      else {
        local_388->use_count = local_388->use_count + 1;
      }
    }
    local_3a8.write_.shared_alloc_.direct_ptr = local_380;
    separate_by_color(&local_228,&local_170,&local_448,&local_3a8);
    local_4c8._0_8_ =
         __return_storage_ptr__->_M_elems[1]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_4c8._8_8_ =
         __return_storage_ptr__->_M_elems[1]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_4c8._16_8_ =
         __return_storage_ptr__->_M_elems[1]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__->_M_elems[1]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    __return_storage_ptr__->_M_elems[1]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    __return_storage_ptr__->_M_elems[1]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
              ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)local_4c8);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_228);
    pAVar5 = local_3a8.write_.shared_alloc_.alloc;
    if (((ulong)local_3a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_3a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_3a8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_3a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_448.write_.shared_alloc_.alloc;
    if (((ulong)local_448.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_448.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_448.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    Cavs::~Cavs(&local_170);
    pCVar3 = this->_M_elems[0].super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         *(Alloc **)&(pCVar3->keys2old_elems).a2ab.write_;
    if (((ulong)local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_1b0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).a2ab.write_ + 8);
    local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_1b0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2old_elems).ab2b.write_ + 8);
    local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_1b0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).a2ab.write_ + 8);
    local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (pCVar3->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                             _vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_1b0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         *(void **)((long)&(pCVar3->keys2new_elems).ab2b.write_ + 8);
    local_458.write_.shared_alloc_.alloc = local_508;
    if (((ulong)local_508 & 7) == 0 && local_508 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_458.write_.shared_alloc_.alloc = (Alloc *)(local_508->size * 8 + 1);
      }
      else {
        local_508->use_count = local_508->use_count + 1;
      }
    }
    local_458.write_.shared_alloc_.direct_ptr = local_500;
    local_3b8.write_.shared_alloc_.alloc = local_518;
    if (((ulong)local_518 & 7) == 0 && local_518 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_3b8.write_.shared_alloc_.alloc = (Alloc *)(local_518->size * 8 + 1);
      }
      else {
        local_518->use_count = local_518->use_count + 1;
      }
    }
    local_3b8.write_.shared_alloc_.direct_ptr = local_510;
    separate_by_color(&local_228,&local_1b0,&local_458,&local_3b8);
    local_4c8._0_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_4c8._8_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_4c8._16_8_ =
         __return_storage_ptr__->_M_elems[2]._M_elems[2].
         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__->_M_elems[2]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_start;
    __return_storage_ptr__->_M_elems[2]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_finish;
    __return_storage_ptr__->_M_elems[2]._M_elems[2].
    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
              ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)local_4c8);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_228);
    pAVar5 = local_3b8.write_.shared_alloc_.alloc;
    if (((ulong)local_3b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_3b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_3b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_3b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_458.write_.shared_alloc_.alloc;
    if (((ulong)local_458.write_.shared_alloc_.alloc & 7) == 0 &&
        local_458.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_458.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_458.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    Cavs::~Cavs(&local_1b0);
    if (((ulong)local_388 & 7) == 0 && local_388 != (Alloc *)0x0) {
      piVar1 = &local_388->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_388);
        operator_delete(local_388,0x48);
      }
    }
    if (((ulong)local_378 & 7) == 0 && local_378 != (Alloc *)0x0) {
      piVar1 = &local_378->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_378);
        operator_delete(local_378,0x48);
      }
    }
    if (((ulong)local_528 & 7) == 0 && local_528 != (Alloc *)0x0) {
      piVar1 = &local_528->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_528);
        operator_delete(local_528,0x48);
      }
    }
    if (((ulong)local_518 & 7) == 0 && local_518 != (Alloc *)0x0) {
      piVar1 = &local_518->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_518);
        operator_delete(local_518,0x48);
      }
    }
    if (((ulong)local_508 & 7) == 0 && local_508 != (Alloc *)0x0) {
      piVar1 = &local_508->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_508);
        operator_delete(local_508,0x48);
      }
    }
    if (((ulong)local_348 & 7) == 0 && local_348 != (Alloc *)0x0) {
      piVar1 = &local_348->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_348);
        operator_delete(local_348,0x48);
      }
    }
    if (((ulong)local_210._M_pi & 7) == 0 && (Alloc *)local_210._M_pi != (Alloc *)0x0) {
      p_Var2 = local_210._M_pi + 3;
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_210._M_pi);
        operator_delete(local_210._M_pi,0x48);
      }
    }
    if (((ulong)local_1f0._M_pi & 7) == 0 && (Alloc *)local_1f0._M_pi != (Alloc *)0x0) {
      p_Var2 = local_1f0._M_pi + 3;
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_1f0._M_pi);
        operator_delete(local_1f0._M_pi,0x48);
      }
    }
    if (((ulong)local_4f8 & 7) == 0 && local_4f8 != (Alloc *)0x0) {
      piVar1 = &local_4f8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_4f8);
        operator_delete(local_4f8,0x48);
      }
    }
    if (((ulong)local_3e8 & 7) == 0 && local_3e8 != (Alloc *)0x0) {
      piVar1 = &local_3e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_3e8);
        operator_delete(local_3e8,0x48);
      }
    }
    if (((ulong)local_2f8 & 7) == 0 && local_2f8 != (Alloc *)0x0) {
      piVar1 = &local_2f8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2f8);
        operator_delete(local_2f8,0x48);
      }
    }
    if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
      piVar1 = &local_2e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2e8);
        operator_delete(local_2e8,0x48);
      }
    }
    if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
      piVar1 = &local_2c8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2c8);
        operator_delete(local_2c8,0x48);
      }
    }
    if (((ulong)local_1c0._M_pi & 7) == 0 && (Alloc *)local_1c0._M_pi != (Alloc *)0x0) {
      p_Var2 = local_1c0._M_pi + 3;
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_1c0._M_pi);
        operator_delete(local_1c0._M_pi,0x48);
      }
    }
    if (((ulong)local_4e8 & 7) == 0 && local_4e8 != (Alloc *)0x0) {
      piVar1 = &local_4e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_4e8);
        operator_delete(local_4e8,0x48);
      }
    }
    if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
      piVar1 = &local_278->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_278);
        operator_delete(local_278,0x48);
      }
    }
    if (((ulong)local_4d8 & 7) == 0 && local_4d8 != (Alloc *)0x0) {
      piVar1 = &local_4d8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_4d8);
        operator_delete(local_4d8,0x48);
      }
    }
    if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
      piVar1 = &local_258->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_258);
        operator_delete(local_258,0x48);
      }
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

static CavsByBdryStatus separate_cavities(Mesh* old_mesh, Mesh* new_mesh,
    Cavs cavs, Int key_dim, LOs keys2kds, Graph* keys2doms = nullptr) {
  CavsByBdryStatus out;
  auto old_elems_are_bdry_i8 = get_elems_are_bdry(old_mesh);
  auto old_elems_are_bdry = array_cast<LO>(old_elems_are_bdry_i8);
  auto cavs2nbdry_elems =
      graph_reduce(cavs.keys2old_elems, old_elems_are_bdry, 1, OMEGA_H_SUM);
  auto cavs_are_bdry = each_gt(cavs2nbdry_elems, 0);
  auto cavs_arent_bdry = invert_marks(cavs_are_bdry);
  auto int_cavs2cavs = collect_marked(cavs_arent_bdry);
  out[NOT_BDRY][NO_COLOR].push_back(unmap_cavs(int_cavs2cavs, cavs));
  auto kd_class_dims = old_mesh->get_array<I8>(key_dim, "class_dim");
  auto key_class_dims = read(unmap(keys2kds, kd_class_dims, 1));
  auto keys_are_bdry = each_lt(key_class_dims, I8(old_mesh->dim()));
  auto bdry_cavs2cavs = collect_marked(keys_are_bdry);
  out[KEY_BDRY][NO_COLOR].push_back(unmap_cavs(bdry_cavs2cavs, cavs));
  if (keys2doms) *keys2doms = unmap_graph(bdry_cavs2cavs, *keys2doms);
  auto keys_arent_bdry = invert_marks(keys_are_bdry);
  auto cavs_touch_bdry = land_each(cavs_are_bdry, keys_arent_bdry);
  auto touch_cavs2cavs = collect_marked(cavs_touch_bdry);
  out[TOUCH_BDRY][NO_COLOR].push_back(unmap_cavs(touch_cavs2cavs, cavs));
  out[NOT_BDRY][CLASS_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  out[TOUCH_BDRY][CLASS_COLOR].push_back(out[TOUCH_BDRY][NO_COLOR][0]);
  auto old_elem_class_ids = get_elem_class_ids(old_mesh);
  auto new_elem_class_ids = get_elem_class_ids(new_mesh);
  out[KEY_BDRY][CLASS_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  out[NOT_BDRY][CLASS_BDRY_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  auto old_bdry_colors = old_elems_are_bdry;
  auto new_elems_are_bdry = get_elems_are_bdry(new_mesh);
  auto new_bdry_colors = array_cast<LO>(new_elems_are_bdry);
  out[TOUCH_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[TOUCH_BDRY][NO_COLOR][0], old_bdry_colors, new_bdry_colors);
  out[KEY_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  return out;
}